

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateImplMemberInit
          (MessageGenerator *this,Printer *p,InitType init_type)

{
  Options *options;
  FieldGeneratorTable *this_00;
  pointer ppFVar1;
  FieldDescriptor *field;
  ushort *puVar2;
  Printer *pPVar3;
  bool bVar4;
  ArenaDtorNeeds AVar5;
  FieldGenerator *this_01;
  value_type pOVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined1 split;
  char *in_R8;
  pointer ppFVar9;
  Printer *p_local;
  MessageGenerator *local_180;
  InitType local_174;
  size_t local_170;
  Printer *local_168;
  allocator<char> local_159;
  MemberInitSeparator separator;
  Iterator __begin4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  bool dtor_on_demand;
  undefined3 uStack_107;
  Descriptor *local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  undefined1 local_e8 [64];
  __index_type local_a8;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  bool local_80;
  bool local_38;
  
  options = &this->options_;
  p_local = p;
  local_180 = this;
  bVar4 = HasSimpleBaseClass(this->descriptor_,options);
  if (bVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0xaec,"!HasSimpleBaseClass(descriptor_, options_)");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_e8)
    ;
  }
  local_170 = (p->options_).spaces_per_indent;
  p->indent_ = p->indent_ + local_170;
  separator.separators_ = false;
  local_174 = init_type;
  local_168 = p;
  separator.printer_ = p;
  if ((init_type != kConstexpr) && (0 < local_180->descriptor_->extension_range_count_)) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    io::Printer::Emit(p_local,0x1f,"_extensions_{visibility, arena}");
  }
  if ((local_180->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_180->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    AVar5 = NeedsArenaDestructor(local_180);
    _dtor_on_demand = CONCAT31(uStack_107,AVar5 == kOnDemand);
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    pPVar3 = p_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin4,"values",(allocator<char> *)&local_f8);
    local_e8._0_8_ = local_e8 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__begin4._0_8_ == &local_138) {
      local_e8._24_8_ = local_138._8_8_;
    }
    else {
      local_e8._0_8_ = __begin4._0_8_;
    }
    local_e8._17_7_ = local_138._M_allocated_capacity._1_7_;
    local_e8[0x10] = local_138._M_local_buf[0];
    local_e8._8_8_ = __begin4.descriptor;
    __begin4.descriptor = (Descriptor *)0x0;
    local_138._M_local_buf[0] = '\0';
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    __begin4._0_8_ = &local_138;
    local_128._M_unused._M_object = operator_new(0x20);
    *(MessageGenerator **)local_128._M_unused._0_8_ = local_180;
    *(Printer ***)((long)local_128._M_unused._0_8_ + 8) = &p_local;
    *(bool **)((long)local_128._M_unused._0_8_ + 0x10) = &dtor_on_demand;
    *(code *)((long)local_128._M_unused._0_8_ + 0x18) = (code)0x0;
    pcStack_110 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_e8 + 0x20),
               (function<bool_()> *)&local_128);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    local_a0._M_p = (pointer)&local_90;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    local_80 = false;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = false;
    in_R8 = "_inlined_string_donated_{$values$}";
    io::Printer::Emit(pPVar3,local_e8,1,0x22);
    io::Printer::Sub::~Sub((Sub *)local_e8);
    std::__cxx11::string::~string((string *)&__begin4);
  }
  if ((local_180->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_180->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_174 == kArenaCopy) {
      cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
      io::Printer::Emit(p_local,0x1b,"_has_bits_{from._has_bits_}");
    }
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    io::Printer::Emit(p_local,0x10,"_cached_size_{0}");
  }
  ppFVar1 = (local_180->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &local_180->field_generators_;
  for (ppFVar9 = (local_180->optimized_order_).
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; split = SUB81(in_R8,0),
      ppFVar9 != ppFVar1; ppFVar9 = ppFVar9 + 1) {
    field = *ppFVar9;
    bVar4 = ShouldSplit(field,options);
    if (!bVar4) {
      this_01 = FieldGeneratorTable::get(this_00,field);
      if (local_174 == kArenaCopy) {
        if (((this_01->impl_)._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
             .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
            _M_head_impl)->has_trivial_value_ == false) {
          cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
          FieldGenerator::GenerateMemberCopyConstructor(this_01,p_local);
        }
      }
      else if (local_174 == kArena) {
        if (((this_01->impl_)._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
             .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
            _M_head_impl)->has_trivial_zero_default_ == false) {
          cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
          FieldGenerator::GenerateMemberConstructor(this_01,p_local);
        }
      }
      else if (local_174 == kConstexpr) {
        cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
        FieldGenerator::GenerateMemberConstexprConstructor(this_01,p_local);
      }
    }
  }
  bVar4 = ShouldSplit(local_180->descriptor_,options);
  if (bVar4) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    pPVar3 = p_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128._M_pod_data,"name",(allocator<char> *)&dtor_on_demand);
    DefaultInstanceName_abi_cxx11_
              ((string *)&__begin4,(cpp *)local_180->descriptor_,(Descriptor *)options,
               (Options *)0x1,(bool)split);
    io::Printer::Sub::Sub<std::__cxx11::string>
              ((Sub *)local_e8,(string *)&local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin4);
    io::Printer::Emit(pPVar3,local_e8,1,0x2e,"_split_{const_cast<Split*>(&$name$._instance)}");
    io::Printer::Sub::~Sub((Sub *)local_e8);
    std::__cxx11::string::~string((string *)&__begin4);
    std::__cxx11::string::~string((string *)local_128._M_pod_data);
  }
  __begin4.descriptor = local_180->descriptor_;
  __begin4._0_8_ = __begin4._0_8_ & 0xffffffff00000000;
  _dtor_on_demand = (__begin4.descriptor)->real_oneof_decl_count_;
  local_100 = __begin4.descriptor;
  while (bVar4 = cpp::operator!=(&__begin4,(Iterator *)&dtor_on_demand), bVar4) {
    pOVar6 = OneOfRangeImpl::Iterator::operator*(&__begin4);
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    pPVar3 = p_local;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128._M_pod_data,"name",&local_159);
    puVar2 = (ushort *)(pOVar6->all_names_).payload_;
    local_f8._M_len = (size_t)*puVar2;
    local_f8._M_str = (char *)((long)puVar2 + ~local_f8._M_len);
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              ((Sub *)local_e8,(string *)&local_128,&local_f8);
    io::Printer::Emit(pPVar3,(Sub *)local_e8,1,9,"$name$_{}");
    io::Printer::Sub::~Sub((Sub *)local_e8);
    std::__cxx11::string::~string((string *)local_128._M_pod_data);
    __begin4.idx = __begin4.idx + 1;
  }
  if ((local_180->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (local_180->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    io::Printer::Emit(p_local,0x10,"_cached_size_{0}");
  }
  _dtor_on_demand = local_180->descriptor_->real_oneof_decl_count_;
  if (_dtor_on_demand == 0) {
LAB_001f03fa:
    if (local_174 == kConstexpr) goto LAB_001f0545;
  }
  else {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    pPVar3 = p_local;
    if (local_174 != kArenaCopy) {
      io::Printer::Emit(p_local,0xe,"_oneof_case_{}");
      goto LAB_001f03fa;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&__begin4,"cases",(allocator<char> *)&local_f8);
    local_e8._0_8_ = local_e8 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__begin4._0_8_ == &local_138) {
      local_e8._24_8_ = local_138._8_8_;
    }
    else {
      local_e8._0_8_ = __begin4._0_8_;
    }
    local_e8._17_7_ = local_138._M_allocated_capacity._1_7_;
    local_e8[0x10] = local_138._M_local_buf[0];
    local_e8._8_8_ = __begin4.descriptor;
    __begin4.descriptor = (Descriptor *)0x0;
    local_138._M_local_buf[0] = '\0';
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    __begin4._0_8_ = &local_138;
    local_128._M_unused._M_object = operator_new(0x18);
    *(bool **)local_128._M_unused._0_8_ = &dtor_on_demand;
    *(Printer ***)((long)local_128._M_unused._0_8_ + 8) = &p_local;
    *(code *)((long)local_128._M_unused._0_8_ + 0x10) = (code)0x0;
    pcStack_110 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_manager;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              ((variant<std::__cxx11::string,std::function<bool()>> *)(local_e8 + 0x20),
               (function<bool_()> *)&local_128);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    local_a0._M_p = (pointer)&local_90;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    local_80 = false;
    if (local_a8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_a0);
    }
    local_38 = false;
    io::Printer::Emit(pPVar3,local_e8,1,0x15,"_oneof_case_{$cases$}");
    io::Printer::Sub::~Sub((Sub *)local_e8);
    std::__cxx11::string::~string((string *)&__begin4);
  }
  if (local_180->num_weak_fields_ != 0) {
    cpp::anon_unknown_0::MemberInitSeparator::operator()(&separator);
    uVar8 = 0x23;
    if (local_174 == kArenaCopy) {
      uVar8 = 0x3a;
    }
    pcVar7 = "_weak_field_map_{visibility, arena}";
    if (local_174 == kArenaCopy) {
      pcVar7 = "_weak_field_map_{visibility, arena, from._weak_field_map_}";
    }
    io::Printer::Emit(p_local,uVar8,pcVar7);
  }
LAB_001f0545:
  cpp::anon_unknown_0::MemberInitSeparator::~MemberInitSeparator(&separator);
  local_168->indent_ = local_168->indent_ - local_170;
  return;
}

Assistant:

void MessageGenerator::GenerateImplMemberInit(io::Printer* p,
                                              InitType init_type) {
  ABSL_DCHECK(!HasSimpleBaseClass(descriptor_, options_));

  auto indent = p->WithIndent();
  MemberInitSeparator separator(p);

  auto init_extensions = [&] {
    if (descriptor_->extension_range_count() > 0 &&
        init_type != InitType::kConstexpr) {
      separator();
      p->Emit("_extensions_{visibility, arena}");
    }
  };

  auto init_inlined_string_indices = [&] {
    if (!inlined_string_indices_.empty()) {
      bool dtor_on_demand = NeedsArenaDestructor() == ArenaDtorNeeds::kOnDemand;
      auto values = [&] {
        for (size_t i = 0; i < InlinedStringDonatedSize(); ++i) {
          if (i > 0) {
            p->Emit(", ");
          }
          p->Emit(dtor_on_demand
                      ? "::_pbi::InitDonatingStates()"
                      : "::_pbi::InitDonatingStates() & 0xFFFFFFFEu");
        }
      };
      separator();
      p->Emit({{"values", values}}, "_inlined_string_donated_{$values$}");
    }
  };

  auto init_has_bits = [&] {
    if (!has_bit_indices_.empty()) {
      if (init_type == InitType::kArenaCopy) {
        separator();
        p->Emit("_has_bits_{from._has_bits_}");
      }
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_fields = [&] {
    for (auto* field : optimized_order_) {
      if (ShouldSplit(field, options_)) continue;

      auto const& generator = field_generators_.get(field);
      switch (init_type) {
        case InitType::kConstexpr:
          separator();
          generator.GenerateMemberConstexprConstructor(p);
          break;
        case InitType::kArena:
          if (!generator.has_trivial_zero_default()) {
            separator();
            generator.GenerateMemberConstructor(p);
          }
          break;
        case InitType::kArenaCopy:
          if (!generator.has_trivial_value()) {
            separator();
            generator.GenerateMemberCopyConstructor(p);
          }
          break;
      }
    }
  };

  auto init_split = [&] {
    if (ShouldSplit(descriptor_, options_)) {
      separator();
      p->Emit({{"name", DefaultInstanceName(descriptor_, options_, true)}},
              "_split_{const_cast<Split*>(&$name$._instance)}");
    }
  };

  auto init_oneofs = [&] {
    for (auto oneof : OneOfRange(descriptor_)) {
      separator();
      p->Emit({{"name", oneof->name()}}, "$name$_{}");
    }
  };

  auto init_cached_size_if_no_hasbits = [&] {
    if (has_bit_indices_.empty()) {
      separator();
      p->Emit("_cached_size_{0}");
    }
  };

  auto init_oneof_cases = [&] {
    if (int count = descriptor_->real_oneof_decl_count()) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        auto cases = [&] {
          for (int i = 0; i < count; ++i) {
            p->Emit({{"index", i}, {"comma", i ? ", " : ""}},
                    "$comma$from._oneof_case_[$index$]");
          }
        };
        p->Emit({{"cases", cases}}, "_oneof_case_{$cases$}");
      } else {
        p->Emit("_oneof_case_{}");
      }
    }
  };

  auto init_weak_field_map = [&] {
    if (num_weak_fields_ && init_type != InitType::kConstexpr) {
      separator();
      if (init_type == InitType::kArenaCopy) {
        p->Emit("_weak_field_map_{visibility, arena, from._weak_field_map_}");
      } else {
        p->Emit("_weak_field_map_{visibility, arena}");
      }
    }
  };

  // Initialization order of the various fields inside `_impl_(...)`
  init_extensions();
  init_inlined_string_indices();
  init_has_bits();
  init_fields();
  init_split();
  init_oneofs();
  init_cached_size_if_no_hasbits();
  init_oneof_cases();
  init_weak_field_map();
}